

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicInputCase6::Run(BasicInputCase6 *this)

{
  CallLogWrapper *this_00;
  Vec4 *pVVar1;
  long lVar2;
  GLuint i;
  GLuint GVar3;
  GLuint i_1;
  GLubyte d [4];
  undefined8 local_38;
  undefined8 uStack_30;
  
  this_00 = &(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  GVar3 = 0;
  do {
    glu::CallLogWrapper::glVertexAttrib4f(this_00,GVar3,0.0,0.0,0.0,0.0);
    GVar3 = GVar3 + 1;
  } while (GVar3 != 0x10);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
  GVar3 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0xe0,(void *)0x0,0x88e4);
  local_38 = CONCAT44(local_38._4_4_,0x4030201);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,4,&local_38);
  local_38 = 0x8000700060005;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,4,8,&local_38);
  local_38 = 0xa00000009;
  uStack_30 = 0xc0000000b;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xc,0x10,&local_38);
  local_38 = CONCAT44(local_38._4_4_,0x4fd02ff);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x1c,4,&local_38);
  local_38 = 0x8fff90006fffb;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x20,8,&local_38);
  local_38 = 0xafffffff7;
  uStack_30 = 0xcfffffff5;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x28,0x10,&local_38);
  local_38 = 0x41600000c1500000;
  uStack_30 = 0x41800000c1700000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x38,0x10,&local_38);
  local_38 = 0x4d40cd004cc0cc80;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x48,8,&local_38);
  local_38._0_4_ = 0x80c02c00;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x68,4,&local_38);
  local_38._0_4_ = 0x40cfd400;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x6c,4,&local_38);
  local_38 = CONCAT44(local_38._4_4_,0x19181716);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x70,4,&local_38);
  local_38 = 0x1d001c001b001a;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x74,8,&local_38);
  local_38 = 0x1f0000001e;
  uStack_30 = 0x2100000020;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x7c,0x10,&local_38);
  local_38 = CONCAT44(local_38._4_4_,0x25dc23de);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x8c,4,&local_38);
  local_38 = 0x29ffd80027ffda;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x90,8,&local_38);
  local_38 = 0x2bffffffd6;
  uStack_30 = 0x2dffffffd4;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x98,0x10,&local_38);
  local_38 = 0x423c0000c2380000;
  uStack_30 = 0x42440000c2400000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xa8,0x10,&local_38);
  local_38 = 0x52a0d2805260d240;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xb8,8,&local_38);
  local_38._0_4_ = 0x40c02c00;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xd8,4,&local_38);
  local_38 = CONCAT44(local_38._4_4_,0xe0cff47b);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xdc,4,&local_38);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,4,0x1401,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,1,4,0x1403,'\0',4);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,4,0x1405,'\0',0xc);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,3,4,0x1400,'\0',0x1c);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,4,4,0x1402,'\0',0x20);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,5,4,0x1404,'\0',0x28);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,6,4,0x1406,'\0',0x38);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,7,4,0x140b,'\0',0x48);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,8,4,0x8368,'\0',0x68);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,9,4,0x8d9f,'\0',0x6c);
  do {
    glu::CallLogWrapper::glVertexAttribBinding(this_00,GVar3,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,GVar3);
    GVar3 = GVar3 + 1;
  } while (GVar3 != 10);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x70);
  (this->super_BasicInputBase).expected_data[0].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0].m_data[1] = 2.0;
  (this->super_BasicInputBase).expected_data[0].m_data[2] = 3.0;
  (this->super_BasicInputBase).expected_data[0].m_data[3] = 4.0;
  (this->super_BasicInputBase).expected_data[1].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[1].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[1].m_data[2] = 7.0;
  pVVar1[1].m_data[3] = 8.0;
  (this->super_BasicInputBase).expected_data[2].m_data[0] = 9.0;
  (this->super_BasicInputBase).expected_data[2].m_data[1] = 10.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[2].m_data[2] = 11.0;
  pVVar1[2].m_data[3] = 12.0;
  (this->super_BasicInputBase).expected_data[3].m_data[0] = -1.0;
  (this->super_BasicInputBase).expected_data[3].m_data[1] = 2.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[3].m_data[2] = -3.0;
  pVVar1[3].m_data[3] = 4.0;
  (this->super_BasicInputBase).expected_data[4].m_data[0] = -5.0;
  (this->super_BasicInputBase).expected_data[4].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[4].m_data[2] = -7.0;
  pVVar1[4].m_data[3] = 8.0;
  (this->super_BasicInputBase).expected_data[5].m_data[0] = -9.0;
  (this->super_BasicInputBase).expected_data[5].m_data[1] = 10.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[5].m_data[2] = -11.0;
  pVVar1[5].m_data[3] = 12.0;
  (this->super_BasicInputBase).expected_data[6].m_data[0] = -13.0;
  (this->super_BasicInputBase).expected_data[6].m_data[1] = 14.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[6].m_data[2] = -15.0;
  pVVar1[6].m_data[3] = 16.0;
  (this->super_BasicInputBase).expected_data[7].m_data[0] = -18.0;
  (this->super_BasicInputBase).expected_data[7].m_data[1] = 19.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[7].m_data[2] = -20.0;
  pVVar1[7].m_data[3] = 21.0;
  (this->super_BasicInputBase).expected_data[8].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[8].m_data[1] = 11.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[8].m_data[2] = 12.0;
  pVVar1[8].m_data[3] = 2.0;
  (this->super_BasicInputBase).expected_data[9].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[9].m_data[1] = -11.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[9].m_data[2] = 12.0;
  pVVar1[9].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0xf].m_data[0] = 22.0;
  (this->super_BasicInputBase).expected_data[0xf].m_data[1] = 23.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0xf].m_data[2] = 24.0;
  pVVar1[0xf].m_data[3] = 25.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[0] = 26.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[1] = 27.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x10].m_data[2] = 28.0;
  pVVar1[0x10].m_data[3] = 29.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[0] = 30.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[1] = 31.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x11].m_data[2] = 32.0;
  pVVar1[0x11].m_data[3] = 33.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[0] = -34.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[1] = 35.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x12].m_data[2] = -36.0;
  pVVar1[0x12].m_data[3] = 37.0;
  (this->super_BasicInputBase).expected_data[0x13].m_data[0] = -38.0;
  (this->super_BasicInputBase).expected_data[0x13].m_data[1] = 39.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x13].m_data[2] = -40.0;
  pVVar1[0x13].m_data[3] = 41.0;
  (this->super_BasicInputBase).expected_data[0x14].m_data[0] = -42.0;
  (this->super_BasicInputBase).expected_data[0x14].m_data[1] = 43.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x14].m_data[2] = -44.0;
  pVVar1[0x14].m_data[3] = 45.0;
  (this->super_BasicInputBase).expected_data[0x15].m_data[0] = -46.0;
  (this->super_BasicInputBase).expected_data[0x15].m_data[1] = 47.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x15].m_data[2] = -48.0;
  pVVar1[0x15].m_data[3] = 49.0;
  (this->super_BasicInputBase).expected_data[0x16].m_data[0] = -50.0;
  (this->super_BasicInputBase).expected_data[0x16].m_data[1] = 51.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x16].m_data[2] = -52.0;
  pVVar1[0x16].m_data[3] = 53.0;
  (this->super_BasicInputBase).expected_data[0x17].m_data[0] = 0.0;
  (this->super_BasicInputBase).expected_data[0x17].m_data[1] = 11.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x17].m_data[2] = 12.0;
  pVVar1[0x17].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x18].m_data[0] = 123.0;
  (this->super_BasicInputBase).expected_data[0x18].m_data[1] = -3.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x18].m_data[2] = -500.0;
  pVVar1[0x18].m_data[3] = -1.0;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		const int kStride = 112;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, kStride * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLubyte d[] = { 1, 2, 3, 4 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 5, 6, 7, 8 };
			glBufferSubData(GL_ARRAY_BUFFER, 4, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 9, 10, 11, 12 };
			glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { -1, 2, -3, 4 };
			glBufferSubData(GL_ARRAY_BUFFER, 28, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { -5, 6, -7, 8 };
			glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { -9, 10, -11, 12 };
			glBufferSubData(GL_ARRAY_BUFFER, 40, sizeof(d), d);
		}
		/* */
		{
			GLfloat d[] = { -13.0f, 14.0f, -15.0f, 16.0f };
			glBufferSubData(GL_ARRAY_BUFFER, 56, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(-18.0), FloatToHalf(19.0), FloatToHalf(-20.0), FloatToHalf(21.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 72, sizeof(d), d);
		}
		/* */
		{
			GLuint d = 0 | (11 << 10) | (12 << 20) | (2u << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 104, sizeof(d), &d);
		}
		/* */
		{
			GLint d = 0 | ((0xFFFFFFF5 << 10) & (0x3ff << 10)) | (12 << 20) | (1 << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 108, sizeof(d), &d);
		}

		/* */
		{
			GLubyte d[] = { 22, 23, 24, 25 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 26, 27, 28, 29 };
			glBufferSubData(GL_ARRAY_BUFFER, 4 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 30, 31, 32, 33 };
			glBufferSubData(GL_ARRAY_BUFFER, 12 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { -34, 35, -36, 37 };
			glBufferSubData(GL_ARRAY_BUFFER, 28 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { -38, 39, -40, 41 };
			glBufferSubData(GL_ARRAY_BUFFER, 32 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { -42, 43, -44, 45 };
			glBufferSubData(GL_ARRAY_BUFFER, 40 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLfloat d[] = { -46.0f, 47.0f, -48.0f, 49.0f };
			glBufferSubData(GL_ARRAY_BUFFER, 56 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(-50.0), FloatToHalf(51.0), FloatToHalf(-52.0), FloatToHalf(53.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 72 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d = 0 | (11 << 10) | (12 << 20) | (1 << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 104 + kStride, sizeof(d), &d);
		}
		/* */
		{
			GLint d = 123 | ((0xFFFFFFFD << 10) & (0x3ff << 10)) | ((0xFFFFFE0C << 20) & (0x3ff << 20)) |
					  ((0xFFFFFFFF << 30) & (0x3 << 30));
			glBufferSubData(GL_ARRAY_BUFFER, 108 + kStride, sizeof(d), &d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 4, GL_UNSIGNED_BYTE, GL_FALSE, 0);
		glVertexAttribFormat(1, 4, GL_UNSIGNED_SHORT, GL_FALSE, 4);
		glVertexAttribFormat(2, 4, GL_UNSIGNED_INT, GL_FALSE, 12);
		glVertexAttribFormat(3, 4, GL_BYTE, GL_FALSE, 28);
		glVertexAttribFormat(4, 4, GL_SHORT, GL_FALSE, 32);
		glVertexAttribFormat(5, 4, GL_INT, GL_FALSE, 40);
		glVertexAttribFormat(6, 4, GL_FLOAT, GL_FALSE, 56);
		glVertexAttribFormat(7, 4, GL_HALF_FLOAT, GL_FALSE, 72);
		glVertexAttribFormat(8, 4, GL_UNSIGNED_INT_2_10_10_10_REV, GL_FALSE, 104);
		glVertexAttribFormat(9, 4, GL_INT_2_10_10_10_REV, GL_FALSE, 108);
		for (GLuint i = 0; i < 10; ++i)
		{
			glVertexAttribBinding(i, 0);
			glEnableVertexAttribArray(i);
		}
		glBindVertexBuffer(0, m_vbo, 0, kStride);

		expected_data[0]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[1]	  = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[2]	  = Vec4(9.0f, 10.0f, 11.0f, 12.0f);
		expected_data[3]	  = Vec4(-1.0f, 2.0f, -3.0f, 4.0f);
		expected_data[4]	  = Vec4(-5.0f, 6.0f, -7.0f, 8.0f);
		expected_data[5]	  = Vec4(-9.0f, 10.0f, -11.0f, 12.0f);
		expected_data[6]	  = Vec4(-13.0f, 14.0f, -15.0f, 16.0f);
		expected_data[7]	  = Vec4(-18.0f, 19.0f, -20.0f, 21.0f);
		expected_data[8]	  = Vec4(0.0f, 11.0f, 12.0f, 2.0f);
		expected_data[9]	  = Vec4(0.0f, -11.0f, 12.0f, 1.0f);
		expected_data[0 + 15] = Vec4(22.0f, 23.0f, 24.0f, 25.0f);
		expected_data[1 + 15] = Vec4(26.0f, 27.0f, 28.0f, 29.0f);
		expected_data[2 + 15] = Vec4(30.0f, 31.0f, 32.0f, 33.0f);
		expected_data[3 + 15] = Vec4(-34.0f, 35.0f, -36.0f, 37.0f);
		expected_data[4 + 15] = Vec4(-38.0f, 39.0f, -40.0f, 41.0f);
		expected_data[5 + 15] = Vec4(-42.0f, 43.0f, -44.0f, 45.0f);
		expected_data[6 + 15] = Vec4(-46.0f, 47.0f, -48.0f, 49.0f);
		expected_data[7 + 15] = Vec4(-50.0f, 51.0f, -52.0f, 53.0f);
		expected_data[8 + 15] = Vec4(0.0f, 11.0f, 12.0f, 1.0f);
		expected_data[9 + 15] = Vec4(123.0f, -3.0f, -500.0f, -1.0f);
		return BasicInputBase::Run();
	}